

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O0

Type * __thiscall
mnf::Manifold::getConstView<1,2>
          (Type *__return_storage_ptr__,Manifold *this,ConstRefMat *val,size_t ir,size_t param_3)

{
  Index startRow;
  Index n;
  size_t param_3_local;
  size_t ir_local;
  ConstRefMat *val_local;
  Manifold *this_local;
  
  startRow = getStart<1>(this,ir);
  n = getDim<1>(this,ir);
  Eigen::
  DenseBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
  ::middleRows<long>(__return_storage_ptr__,
                     (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      *)val,startRow,n);
  return __return_storage_ptr__;
}

Assistant:

inline typename ConstViewReturnType<T, F>::Type Manifold::getConstView<T, F>(
    const ConstRefMat& val, size_t ir, size_t) const
{
  return val.middleRows(getStart<T>(ir), getDim<T>(ir));
}